

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

string * __thiscall
bloaty::ItaniumDemangle_abi_cxx11_
          (string *__return_storage_ptr__,bloaty *this,string_view symbol,DataSource source)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  char *__s;
  short *psVar4;
  bloaty *pbVar5;
  ulong uVar6;
  bloaty *pbVar7;
  char demangled [1024];
  bloaty abStack_428 [1032];
  
  psVar4 = (short *)symbol._M_len;
  pbVar5 = abStack_428;
  uVar1 = (uint)symbol._M_str;
  if (uVar1 - 0xb < 0xfffffffe) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    if (this < (bloaty *)0x3) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)((char)psVar4[1] == 'Z' && *psVar4 == 0x5f5f);
    }
    if (uVar1 == 9) {
      __s = __cxa_demangle((char *)(uVar6 + (long)psVar4),(char *)0x0,(size_t *)0x0,(int *)0x0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (__s != (char *)0x0) {
        sVar3 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,__s,__s + sVar3);
        free(__s);
        return __return_storage_ptr__;
      }
    }
    else {
      if (uVar1 != 10) {
        printf("Unexpected source: %d\n",(ulong)uVar1);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                      ,199,"std::string bloaty::ItaniumDemangle(string_view, DataSource)");
      }
      bVar2 = absl::debugging_internal::Demangle
                        ((char *)(uVar6 + (long)psVar4),(char *)abStack_428,0x400);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar2) {
        sVar3 = strlen((char *)abStack_428);
        pbVar7 = abStack_428 + sVar3;
        goto LAB_0018068c;
      }
    }
  }
  pbVar7 = this + (long)psVar4;
  pbVar5 = (bloaty *)psVar4;
LAB_0018068c:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pbVar5,pbVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string ItaniumDemangle(string_view symbol, DataSource source) {
  if (source != DataSource::kShortSymbols &&
      source != DataSource::kFullSymbols) {
    // No demangling.
    return std::string(symbol);
  }

  string_view demangle_from = symbol;
  if (absl::StartsWith(demangle_from, "__Z")) {
    demangle_from.remove_prefix(1);
  }

  if (source == DataSource::kShortSymbols) {
    char demangled[1024];
    if (absl::debugging_internal::Demangle(demangle_from.data(), demangled,
                                           sizeof(demangled))) {
      return std::string(demangled);
    } else {
      return std::string(symbol);
    }
  } else if (source == DataSource::kFullSymbols) {
    char* demangled = __cxa_demangle(demangle_from.data(), NULL, NULL, NULL);
    if (demangled) {
      std::string ret(demangled);
      free(demangled);
      return ret;
    } else {
      return std::string(symbol);
    }
  } else {
    printf("Unexpected source: %d\n", (int)source);
    BLOATY_UNREACHABLE();
  }
}